

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

App * __thiscall CLI::App::get_subcommand(App *this,App *subcom)

{
  pointer psVar1;
  App *pAVar2;
  pointer pcVar3;
  App *in_RAX;
  OptionNotFound *pOVar4;
  pointer psVar5;
  bool bVar6;
  string local_60;
  string local_40;
  
  if (subcom == (App *)0x0) {
    pOVar4 = (OptionNotFound *)__cxa_allocate_exception(0x38);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"nullptr passed","");
    OptionNotFound::OptionNotFound(pOVar4,&local_40);
    __cxa_throw(pOVar4,&OptionNotFound::typeinfo,Error::~Error);
  }
  psVar5 = (this->subcommands_).
           super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->subcommands_).
           super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar6 = psVar5 == psVar1;
  if (!bVar6) {
    pAVar2 = (psVar5->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    in_RAX = pAVar2;
    while (in_RAX != subcom) {
      psVar5 = psVar5 + 1;
      bVar6 = psVar5 == psVar1;
      in_RAX = pAVar2;
      if (bVar6) break;
      in_RAX = (psVar5->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    }
  }
  if (bVar6) {
    pOVar4 = (OptionNotFound *)__cxa_allocate_exception(0x38);
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    pcVar3 = (subcom->name_)._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,pcVar3,pcVar3 + (subcom->name_)._M_string_length);
    OptionNotFound::OptionNotFound(pOVar4,&local_60);
    __cxa_throw(pOVar4,&OptionNotFound::typeinfo,Error::~Error);
  }
  return in_RAX;
}

Assistant:

App *get_subcommand(const App *subcom) const {
        if(subcom == nullptr)
            throw OptionNotFound("nullptr passed");
        for(const App_p &subcomptr : subcommands_)
            if(subcomptr.get() == subcom)
                return subcomptr.get();
        throw OptionNotFound(subcom->get_name());
    }